

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O3

void __thiscall Promise::Resolve(Promise *this,shared_ptr<Promise> *next)

{
  vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_> *__x;
  pointer psVar1;
  element_type *peVar2;
  void *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<Promise> *child_1;
  pointer psVar4;
  shared_ptr<Promise> *child;
  vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_> *__range1;
  value_type local_48;
  
  local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  if ((local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_registered ==
      false) {
    std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
              (&entries,&local_48);
    (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_registered = true;
  }
  this_00._M_pi = local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    if (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
  }
  __x = &this->children;
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::operator=
            (&((next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->children,__x
            );
  psVar4 = (this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      peVar2 = (psVar4->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (peVar2->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar2->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::clear(__x);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
            (__x,next);
  this->state = Resolved;
  pvVar3 = this->data;
  if (pvVar3 != (void *)0x0) {
    psVar1 = (this->children).
             super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->children).
                  super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      ((psVar4->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->passed_value =
           pvVar3;
    }
  }
  return;
}

Assistant:

void Resolve(const PromisePtr& next) {
    Register(next);

    next->children = children;
    for (auto& child : children) {
      child->parent = next;
    }
    children.clear();
    children.push_back(next);

    Resolve();
  }